

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * lshift(Bigint *b,int k)

{
  uint *puVar1;
  undefined4 *puVar2;
  sbyte sVar3;
  int iVar4;
  Bigint *pBVar5;
  ULong *pUVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  iVar10 = k >> 5;
  iVar7 = b->k;
  iVar11 = b->wds + iVar10;
  for (iVar4 = b->maxwds; iVar4 <= iVar11; iVar4 = iVar4 * 2) {
    iVar7 = iVar7 + 1;
  }
  pBVar5 = Balloc(iVar7);
  pUVar6 = pBVar5->x;
  iVar7 = 0;
  if (0 < iVar10) {
    iVar7 = iVar10;
  }
  while (bVar12 = iVar7 != 0, iVar7 = iVar7 + -1, bVar12) {
    *pUVar6 = 0;
    pUVar6 = pUVar6 + 1;
  }
  iVar7 = b->wds;
  if ((k & 0x1fU) == 0) {
    lVar8 = 0;
    do {
      puVar2 = (undefined4 *)((long)b->x + lVar8);
      *(undefined4 *)((long)pUVar6 + lVar8) = *puVar2;
      lVar8 = lVar8 + 4;
    } while (puVar2 + 1 < b->x + iVar7);
  }
  else {
    sVar3 = (sbyte)(k & 0x1fU);
    lVar8 = 0;
    uVar9 = 0;
    do {
      puVar1 = (uint *)((long)b->x + lVar8);
      *(uint *)((long)pUVar6 + lVar8) = *puVar1 << sVar3 | uVar9;
      uVar9 = *puVar1 >> (0x20U - sVar3 & 0x1f);
      lVar8 = lVar8 + 4;
    } while (puVar1 + 1 < b->x + iVar7);
    *(uint *)((long)pUVar6 + lVar8) = uVar9;
    iVar11 = (iVar11 + 1) - (uint)(uVar9 == 0);
  }
  pBVar5->wds = iVar11;
  Bfree(b);
  return pBVar5;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k MTd)
{
	int i, k1, n, n1;
	Bigint *b1;
	ULong *x, *x1, *xe, z;

#ifdef Pack_32
	n = k >> 5;
#else
	n = k >> 4;
#endif
	k1 = b->k;
	n1 = n + b->wds + 1;
	for(i = b->maxwds; n1 > i; i <<= 1)
		k1++;
	b1 = Balloc(k1 MTa);
	x1 = b1->x;
	for(i = 0; i < n; i++)
		*x1++ = 0;
	x = b->x;
	xe = x + b->wds;
#ifdef Pack_32
	if (k &= 0x1f) {
		k1 = 32 - k;
		z = 0;
		do {
			*x1++ = *x << k | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if ((*x1 = z))
			++n1;
		}
#else
	if (k &= 0xf) {
		k1 = 16 - k;
		z = 0;
		do {
			*x1++ = *x << k  & 0xffff | z;
			z = *x++ >> k1;
			}
			while(x < xe);
		if (*x1 = z)
			++n1;
		}
#endif
	else do
		*x1++ = *x++;
		while(x < xe);
	b1->wds = n1 - 1;
	Bfree(b MTa);
	return b1;
	}